

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O3

bool Js::SparseArraySegmentBase::IsLeafSegment(SparseArraySegmentBase *seg,Recycler *recycler)

{
  bool bVar1;
  undefined1 auStack_48 [8];
  RecyclerHeapObjectInfo heapObject;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayLeafSegmentPhase);
  if (!bVar1) {
    heapObject.m_recycler = (Recycler *)0x0;
    heapObject.m_heapBlock = (HeapBlock *)0x0;
    auStack_48 = (undefined1  [8])0x0;
    heapObject.m_address = (void *)0x0;
    heapObject.field_3._0_1_ = 0;
    bVar1 = Memory::Recycler::FindHeapObject
                      (recycler,seg,
                       FindHeapObjectFlags_AllowInterior|
                       FindHeapObjectFlags_VerifyFreeBitForAttribute,
                       (RecyclerHeapObjectInfo *)auStack_48);
    if (bVar1) {
      bVar1 = Memory::RecyclerHeapObjectInfo::IsLeaf((RecyclerHeapObjectInfo *)auStack_48);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool SparseArraySegmentBase::IsLeafSegment(SparseArraySegmentBase *seg, Recycler *recycler)
    {
        if (!DoNativeArrayLeafSegment())
        {
            return false;
        }

        RecyclerHeapObjectInfo heapObject;
        if (recycler->FindHeapObject(
                seg,
                (Memory::FindHeapObjectFlags)(FindHeapObjectFlags_VerifyFreeBitForAttribute | FindHeapObjectFlags_AllowInterior),
                heapObject))
        {
            return heapObject.IsLeaf();
        }

        return false;
    }